

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slot.cpp
# Opt level: O1

CK_RV __thiscall Slot::getSlotInfo(Slot *this,CK_SLOT_INFO_PTR info)

{
  size_t __n;
  CK_RV CVar1;
  string sDescription;
  char mfgID [33];
  ostringstream osDescription;
  undefined1 *local_1e8;
  size_t local_1e0;
  undefined1 local_1d8 [16];
  char local_1c8 [40];
  long local_1a0 [3];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  if (info == (CK_SLOT_INFO_PTR)0x0) {
    CVar1 = 7;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"SoftHSM slot ID 0x",0x12);
    *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__cxx11::stringbuf::str();
    builtin_strncpy(local_1c8,"SoftHSM project",0x10);
    builtin_memcpy(info->slotDescription,
                   "                                                                ",0x40);
    builtin_memcpy(info->manufacturerID,"                                ",0x20);
    memcpy(info,local_1e8,local_1e0);
    __n = strlen(local_1c8);
    memcpy(info->manufacturerID,local_1c8,__n);
    info->flags = 1;
    (info->hardwareVersion).major = '\x02';
    (info->hardwareVersion).minor = '\x06';
    (info->firmwareVersion).major = '\x02';
    (info->firmwareVersion).minor = '\x06';
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    CVar1 = 0;
  }
  return CVar1;
}

Assistant:

CK_RV Slot::getSlotInfo(CK_SLOT_INFO_PTR info)
{
	if (info == NULL)
	{
		return CKR_ARGUMENTS_BAD;
	}

	std::ostringstream osDescription;
	osDescription << "SoftHSM slot ID 0x" << std::hex << slotID;
	const std::string sDescription(osDescription.str());

	char mfgID[33];
	snprintf(mfgID, 33, "SoftHSM project");

	memset(info->slotDescription, ' ', 64);
	memset(info->manufacturerID, ' ', 32);
	memcpy(info->slotDescription, sDescription.data(), sDescription.size());
	memcpy(info->manufacturerID, mfgID, strlen(mfgID));

	info->flags = CKF_TOKEN_PRESENT;

	info->hardwareVersion.major = VERSION_MAJOR;
	info->hardwareVersion.minor = VERSION_MINOR;
	info->firmwareVersion.major = VERSION_MAJOR;
	info->firmwareVersion.minor = VERSION_MINOR;

	return CKR_OK;
}